

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Amr.cpp
# Opt level: O0

void __thiscall amrex::Amr::FinalizeInit(Amr *this,Real strt_time,Real stop_time)

{
  double dVar1;
  bool bVar2;
  pointer pAVar3;
  double *pdVar4;
  int *piVar5;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  int lev_4;
  int lev_3;
  int lev_2;
  int lev_1;
  int lev;
  Real dt0;
  char (*in_stack_fffffffffffffc58) [16];
  Print *in_stack_fffffffffffffc60;
  Print *this_00;
  ostream *in_stack_fffffffffffffc88;
  Print *in_stack_fffffffffffffc90;
  int in_stack_fffffffffffffcd0;
  int in_stack_fffffffffffffcd4;
  ostream *in_stack_fffffffffffffcd8;
  Amr *in_stack_fffffffffffffce0;
  Real in_stack_fffffffffffffd28;
  Amr *in_stack_fffffffffffffd30;
  int in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  ostream *in_stack_fffffffffffffe28;
  AmrCore *in_stack_fffffffffffffe30;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  ostream *local_20;
  
  Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
  ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                *)in_stack_fffffffffffffc60,(size_type)in_stack_fffffffffffffc58);
  pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                     ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                      0x10e7f56);
  (*pAVar3->_vptr_AmrLevel[0xd])
            (in_XMM1_Qa,pAVar3,(ulong)*(uint *)(in_RDI + 0x94),(ulong)*(uint *)(in_RDI + 0x900),
             in_RDI + 0x198,in_RDI + 0x10,in_RDI + 0x150);
  pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                     ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc60,
                      (size_type)in_stack_fffffffffffffc58);
  local_20 = (ostream *)*pdVar4;
  pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                     ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc60,
                      (size_type)in_stack_fffffffffffffc58);
  dVar1 = *pdVar4;
  pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                     ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc60,
                      (size_type)in_stack_fffffffffffffc58);
  *pdVar4 = dVar1;
  piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                     ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60,
                      (size_type)in_stack_fffffffffffffc58);
  *piVar5 = 1;
  if (0 < *(int *)(in_RDI + 0xc)) {
    bldFineLevels(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  }
  for (local_24 = 1; local_24 <= *(int *)(in_RDI + 0x94); local_24 = local_24 + 1) {
    piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60,
                        (size_type)in_stack_fffffffffffffc58);
    local_20 = (ostream *)((double)local_20 / (double)*piVar5);
    in_stack_fffffffffffffc88 = local_20;
    pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc60,
                        (size_type)in_stack_fffffffffffffc58);
    *pdVar4 = (double)in_stack_fffffffffffffc88;
    pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc60,
                        (size_type)in_stack_fffffffffffffc58);
    in_stack_fffffffffffffc90 = (Print *)*pdVar4;
    pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc60,
                        (size_type)in_stack_fffffffffffffc58);
    *pdVar4 = (double)in_stack_fffffffffffffc90;
  }
  for (local_28 = 0; local_28 <= *(int *)(in_RDI + 0x94); local_28 = local_28 + 1) {
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)in_stack_fffffffffffffc60,(size_type)in_stack_fffffffffffffc58);
    pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                       ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                        0x10e815b);
    pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc60,
                        (size_type)in_stack_fffffffffffffc58);
    dVar1 = *pdVar4;
    pdVar4 = Vector<double,_std::allocator<double>_>::operator[]
                       ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffc60,
                        (size_type)in_stack_fffffffffffffc58);
    (*pAVar3->_vptr_AmrLevel[0x18])(in_XMM0_Qa,dVar1,*pdVar4);
  }
  for (local_2c = 0; local_2c <= *(int *)(in_RDI + 0x94); local_2c = local_2c + 1) {
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)in_stack_fffffffffffffc60,(size_type)in_stack_fffffffffffffc58);
    pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                       ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                        0x10e821f);
    (*pAVar3->_vptr_AmrLevel[0x13])(pAVar3,0,(ulong)*(uint *)(in_RDI + 0x94));
  }
  for (local_30 = 0; local_30 <= *(int *)(in_RDI + 0x94); local_30 = local_30 + 1) {
    piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60,
                        (size_type)in_stack_fffffffffffffc58);
    *piVar5 = 0;
    piVar5 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffc60,
                        (size_type)in_stack_fffffffffffffc58);
    *piVar5 = 0;
  }
  for (local_34 = 0; local_34 <= *(int *)(in_RDI + 0x94); local_34 = local_34 + 1) {
    Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
    ::operator[]((Vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
                  *)in_stack_fffffffffffffc60,(size_type)in_stack_fffffffffffffc58);
    pAVar3 = std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>::operator->
                       ((unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_> *)
                        0x10e82fb);
    (*pAVar3->_vptr_AmrLevel[0x14])(in_XMM1_Qa);
  }
  bVar2 = ParallelDescriptor::IOProcessor();
  if (bVar2) {
    if (*(int *)(in_RDI + 8) < 2) {
      if (0 < *(int *)(in_RDI + 8)) {
        OutStream();
        this_00 = (Print *)&stack0xfffffffffffffca8;
        Print::Print(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
        Print::operator<<(this_00,in_stack_fffffffffffffc58);
        Print::~Print((Print *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
        OutStream();
        AmrCore::printGridSummary
                  (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28,in_stack_fffffffffffffe24,
                   in_stack_fffffffffffffe20);
      }
    }
    else {
      OutStream();
      Print::Print(in_stack_fffffffffffffc90,in_stack_fffffffffffffc88);
      Print::operator<<(in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      Print::~Print((Print *)CONCAT44(in_stack_fffffffffffffcd4,in_stack_fffffffffffffcd0));
      OutStream();
      printGridInfo(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,
                    in_stack_fffffffffffffcd0);
    }
  }
  if ((*(int *)(in_RDI + 0x2c4) != 0) && (bVar2 = ParallelDescriptor::IOProcessor(), bVar2)) {
    std::operator<<((ostream *)(in_RDI + 0x2d0),"INITIAL GRIDS \n");
    printGridInfo(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd4,
                  in_stack_fffffffffffffcd0);
  }
  return;
}

Assistant:

void
Amr::FinalizeInit (Real              strt_time,
                   Real              stop_time)
{
    BL_PROFILE("Amr::FinalizeInit()");
    //
    // Compute dt and set time levels of all grid data.
    //
    amr_level[0]->computeInitialDt(finest_level,
                                   sub_cycle,
                                   n_cycle,
                                   ref_ratio,
                                   dt_level,
                                   stop_time);
    //
    // The following was added for multifluid.
    //
    Real dt0   = dt_level[0];
    dt_min[0]  = dt_level[0];
    n_cycle[0] = 1;

    if (max_level > 0)
        bldFineLevels(strt_time);

    for (int lev = 1; lev <= finest_level; lev++)
    {
        dt0           /= n_cycle[lev];
        dt_level[lev]  = dt0;
        dt_min[lev]    = dt_level[lev];
    }

    for (int lev = 0; lev <= finest_level; lev++)
        amr_level[lev]->setTimeLevel(strt_time,dt_level[lev],dt_level[lev]);

    for (int lev = 0; lev <= finest_level; lev++)
        amr_level[lev]->post_regrid(0,finest_level);

    for (int lev = 0; lev <= finest_level; lev++)
    {
        level_steps[lev] = 0;
        level_count[lev] = 0;
    }

    //
    // Perform any special post_initialization operations.
    //
    for(int lev(0); lev <= finest_level; ++lev) {
      amr_level[lev]->post_init(stop_time);
    }

    if (ParallelDescriptor::IOProcessor())
    {
       if (verbose > 1)
       {
           amrex::Print() << "INITIAL GRIDS \n";
           printGridInfo(amrex::OutStream(),0,finest_level);
       }
       else if (verbose > 0)
       {
           amrex::Print() << "INITIAL GRIDS \n";
           printGridSummary(amrex::OutStream(),0,finest_level);
       }
    }

    if (record_grid_info && ParallelDescriptor::IOProcessor())
    {
        gridlog << "INITIAL GRIDS \n";
        printGridInfo(gridlog,0,finest_level);
    }

    BL_COMM_PROFILE_NAMETAG("Amr::initialInit BOTTOM");
}